

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtp-rb.c
# Opt level: O1

void rtp_rb_pop(void)

{
  if (rtp_rb == (rtp_pkt_t *)0x0) {
    __assert_fail("rtp_rb != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/rtp-rb.c",0x52,
                  "void rtp_rb_pop(void)");
  }
  if (rtp_rb_end != rtp_rb_start) {
    rtp_rb[rtp_rb_start].length = 0;
    rtp_rb_start = (rtp_rb_start + 1) % rtp_rb_size;
    rtp_rb_cnt = rtp_rb_cnt - 1;
    return;
  }
  __assert_fail("rtp_rb_end != rtp_rb_start",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/rtp-rb.c",0x53,
                "void rtp_rb_pop(void)");
}

Assistant:

void rtp_rb_pop(void) {
  assert(rtp_rb != NULL);
  assert(rtp_rb_end != rtp_rb_start);

  rtp_rb[rtp_rb_start].length = 0;
  rtp_rb_start = (rtp_rb_start + 1) % rtp_rb_size;

  rtp_rb_cnt--;
}